

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration>::relocate
          (QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *this,qsizetype offset
          ,NamespaceDeclaration **data)

{
  bool bVar1;
  NamespaceDeclaration *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  NamespaceDeclaration *res;
  
  first = (NamespaceDeclaration *)(*(long *)(in_RDI + 8) + in_RSI * 0x30);
  QtPrivate::q_relocate_overlap_n<QXmlStreamPrivateTagStack::NamespaceDeclaration,long_long>
            (first,in_RDI,(NamespaceDeclaration *)0x667644);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration>,QXmlStreamPrivateTagStack::NamespaceDeclaration_const*>
                        (data,(QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                              res), bVar1)) {
    *in_RDX = in_RSI * 0x30 + *in_RDX;
  }
  *(NamespaceDeclaration **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }